

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int planrobarm(PlannerType plannerType,char *envCfgFilename,bool forwardSearch)

{
  char cVar1;
  int iVar2;
  anaPlanner *this;
  ostream *poVar3;
  FILE *__stream;
  SBPL_Exception *pSVar4;
  char *__s;
  uint uVar5;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  MDPConfig MDPCfg;
  EnvironmentROBARM environment_robarm;
  
  _environment_robarm = calloc;
  cVar1 = EnvironmentROBARM::InitializeEnv((char *)&environment_robarm);
  if (cVar1 == '\0') {
    pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: InitializeEnv failed");
  }
  else {
    cVar1 = EnvironmentROBARM::InitializeMDPCfg((MDPConfig *)&environment_robarm);
    if (cVar1 != '\0') {
      solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      switch(plannerType) {
      case PLANNER_TYPE_ADSTAR:
        puts("Initializing ADPlanner...");
        this = (anaPlanner *)operator_new(0x98);
        ADPlanner::ADPlanner
                  ((ADPlanner *)this,(DiscreteSpaceInformation *)&environment_robarm,forwardSearch);
        break;
      case PLANNER_TYPE_ARASTAR:
        puts("Initializing ARAPlanner...");
        this = (anaPlanner *)operator_new(0xa0);
        ARAPlanner::ARAPlanner
                  ((ARAPlanner *)this,(DiscreteSpaceInformation *)&environment_robarm,forwardSearch)
        ;
        break;
      default:
        puts("Invalid planner type");
        this = (anaPlanner *)0x0;
        break;
      case PLANNER_TYPE_RSTAR:
        puts("Initializing RSTARPlanner...");
        this = (anaPlanner *)operator_new(0x68);
        RSTARPlanner::RSTARPlanner
                  ((RSTARPlanner *)this,(DiscreteSpaceInformation *)&environment_robarm,
                   forwardSearch);
        break;
      case PLANNER_TYPE_ANASTAR:
        puts("Initializing anaPlanner...");
        this = (anaPlanner *)operator_new(0x48);
        anaPlanner::anaPlanner(this,(DiscreteSpaceInformation *)&environment_robarm,forwardSearch);
      }
      iVar2 = (**(code **)(*(long *)this + 0x28))(this,MDPCfg.startstateid);
      if (iVar2 == 0) {
        pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: failed to set start state");
      }
      else {
        iVar2 = (**(code **)(*(long *)this + 0x20))(this,MDPCfg.goalstateid);
        if (iVar2 != 0) {
          puts("start planning...");
          iVar2 = (*(code *)**(undefined8 **)this)(0,this,&solution_stateIDs_V);
          puts("done planning");
          poVar3 = std::operator<<((ostream *)&std::cout,"size of solution=");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::endl<char,std::char_traits<char>>(poVar3);
          __stream = fopen("sol.txt","w");
          if (__stream != (FILE *)0x0) {
            for (uVar5 = 0;
                (ulong)uVar5 <
                (ulong)((long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
              EnvironmentROBARM::PrintState
                        ((int)&environment_robarm,
                         SUB41(solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar5],0),(_IO_FILE *)0x1);
            }
            fclose(__stream);
            __s = "Solution is found";
            if (iVar2 == 0) {
              __s = "Solution does not exist";
            }
            puts(__s);
            fflush((FILE *)0x0);
            (**(code **)(*(long *)this + 0xa0))(this);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>);
            EnvironmentROBARM::~EnvironmentROBARM(&environment_robarm);
            return iVar2;
          }
          pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: could not open solution file");
          __cxa_throw(pSVar4,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: failed to set goal state");
      }
      __cxa_throw(pSVar4,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: InitializeMDPCfg failed");
  }
  __cxa_throw(pSVar4,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planrobarm(PlannerType plannerType, char* envCfgFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 5.0; //in seconds
    MDPConfig MDPCfg;
    bool bforwardsearch = forwardSearch;

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentROBARM environment_robarm;
    if (!environment_robarm.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_robarm.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //srand(1);

    //plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Initializing RSTARPlanner...\n");
        planner = new RSTARPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_robarm, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    for (unsigned int i = 0; i < solution_stateIDs_V.size(); i++) {
        environment_robarm.PrintState(solution_stateIDs_V[i], true, fSol);
    }
    fclose(fSol);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else
        printf("Solution does not exist\n");

    fflush(NULL);

    delete planner;

    return bRet;
}